

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O0

string * __thiscall
SchemePair::external_repr_abi_cxx11_(string *__return_storage_ptr__,SchemePair *this)

{
  size_t *this_00;
  initializer_list<const_SchemePair_*> __l;
  bool bVar1;
  element_type *peVar2;
  long lVar3;
  element_type *peVar4;
  __shared_ptr *this_01;
  element_type *peVar5;
  size_type sVar6;
  pair<std::_Rb_tree_const_iterator<const_SchemePair_*>,_bool> pVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  _Base_ptr local_1c0;
  undefined1 local_1b8;
  element_type *local_1b0;
  element_type *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  shared_ptr<SchemeObject> local_160;
  allocator<const_SchemePair_*> local_14a;
  less<const_SchemePair_*> local_149;
  SchemePair *local_148;
  iterator local_140;
  size_type local_138;
  undefined1 local_130 [8];
  set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
  visited;
  shared_ptr<SchemePair> pp;
  shared_ptr<SchemeObject> p;
  undefined1 local_c0 [8];
  string res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  shared_ptr<SchemePair> pcdr;
  undefined1 local_60 [8];
  string prefix;
  shared_ptr<SchemeSymbol> pcar;
  allocator local_19;
  SchemePair *local_18;
  SchemePair *this_local;
  
  local_18 = this;
  this_local = (SchemePair *)__return_storage_ptr__;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->car);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"()",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
    return __return_storage_ptr__;
  }
  std::dynamic_pointer_cast<SchemeSymbol,SchemeObject>
            ((shared_ptr<SchemeObject> *)((long)&prefix.field_2 + 8));
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)(prefix.field_2._M_local_buf + 8));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_60,"",
               (allocator *)
               ((long)&pcdr.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&pcdr.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi + 7));
    peVar2 = std::__shared_ptr_access<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(prefix.field_2._M_local_buf + 8));
    bVar1 = std::operator==(&peVar2->value,"quote");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_60,"\'");
    }
    else {
      peVar2 = std::__shared_ptr_access<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(prefix.field_2._M_local_buf + 8));
      bVar1 = std::operator==(&peVar2->value,"quasiquote");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_60,"`");
      }
      else {
        peVar2 = std::__shared_ptr_access<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(prefix.field_2._M_local_buf + 8));
        bVar1 = std::operator==(&peVar2->value,"unquote");
        if (bVar1) {
          std::__cxx11::string::operator=((string *)local_60,",");
        }
        else {
          peVar2 = std::__shared_ptr_access<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(prefix.field_2._M_local_buf + 8));
          bVar1 = std::operator==(&peVar2->value,"unquote-splicing");
          if (bVar1) {
            std::__cxx11::string::operator=((string *)local_60,",@");
          }
        }
      }
    }
    lVar3 = std::__cxx11::string::length();
    if (lVar3 == 0) {
LAB_0016031c:
      res.field_2._12_4_ = 0;
    }
    else {
      std::dynamic_pointer_cast<SchemePair,SchemeObject>((shared_ptr<SchemeObject> *)local_78);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
      if (bVar1) {
        peVar5 = std::__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_78);
        bVar1 = std::operator==(&peVar5->cdr,&scheme_nil);
        if (!bVar1) goto LAB_001602f0;
        peVar5 = std::__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_78);
        peVar4 = std::__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar5->car);
        (*peVar4->_vptr_SchemeObject[2])(&local_98);
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        res.field_2._12_4_ = 1;
      }
      else {
LAB_001602f0:
        res.field_2._12_4_ = 0;
      }
      std::shared_ptr<SchemePair>::~shared_ptr((shared_ptr<SchemePair> *)local_78);
      if (res.field_2._12_4_ == 0) goto LAB_0016031c;
    }
    std::__cxx11::string::~string((string *)local_60);
    if (res.field_2._12_4_ != 0) goto LAB_00160806;
  }
  peVar4 = std::__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->car);
  (*peVar4->_vptr_SchemeObject[2])
            (&p.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,"(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &p.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string
            ((string *)&p.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<SchemeObject>::shared_ptr
            ((shared_ptr<SchemeObject> *)
             &pp.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&this->cdr);
  std::shared_ptr<SchemePair>::shared_ptr
            ((shared_ptr<SchemePair> *)&visited._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_140 = &local_148;
  local_138 = 1;
  local_148 = this;
  std::allocator<const_SchemePair_*>::allocator(&local_14a);
  __l._M_len = local_138;
  __l._M_array = local_140;
  std::set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>::
  set((set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_> *
      )local_130,__l,&local_149,&local_14a);
  std::allocator<const_SchemePair_*>::~allocator(&local_14a);
  while( true ) {
    std::dynamic_pointer_cast<SchemePair,SchemeObject>(&local_160);
    this_01 = (__shared_ptr *)
              std::shared_ptr<SchemePair>::operator=
                        ((shared_ptr<SchemePair> *)
                         &visited._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (shared_ptr<SchemePair> *)&local_160);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this_01);
    std::shared_ptr<SchemePair>::~shared_ptr((shared_ptr<SchemePair> *)&local_160);
    if (!bVar1) break;
    bVar1 = std::operator==((shared_ptr<SchemeObject> *)
                            &pp.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,&scheme_nil);
    if (bVar1) {
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                     ")");
      goto LAB_001607a2;
    }
    peVar5 = std::__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&visited._M_t._M_impl.super__Rb_tree_header._M_node_count);
    peVar4 = std::__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&peVar5->car);
    (*peVar4->_vptr_SchemeObject[2])(&local_1a0);
    std::operator+(&local_180," ",&local_1a0);
    std::__cxx11::string::operator+=((string *)local_c0,(string *)&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    local_1a8 = std::__shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2> *)
                           &visited._M_t._M_impl.super__Rb_tree_header._M_node_count);
    sVar6 = std::
            set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
            ::count((set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
                     *)local_130,&local_1a8);
    if (sVar6 != 0) {
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                     " ...)");
      goto LAB_001607a2;
    }
    this_00 = &visited._M_t._M_impl.super__Rb_tree_header._M_node_count;
    peVar5 = std::__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )this_00);
    std::shared_ptr<SchemeObject>::operator=
              ((shared_ptr<SchemeObject> *)
               &pp.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &peVar5->cdr);
    local_1b0 = std::__shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2> *)this_00);
    pVar7 = std::
            set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
            ::insert((set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
                      *)local_130,&local_1b0);
    local_1c0 = (_Base_ptr)pVar7.first._M_node;
    local_1b8 = pVar7.second;
  }
  std::operator+(&local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0," . "
                );
  peVar4 = std::__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&pp.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (*peVar4->_vptr_SchemeObject[2])(&local_220);
  std::operator+(&local_1e0,&local_200,&local_220);
  std::operator+(__return_storage_ptr__,&local_1e0,")");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
LAB_001607a2:
  res.field_2._12_4_ = 1;
  std::set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>::
  ~set((set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
        *)local_130);
  std::shared_ptr<SchemePair>::~shared_ptr
            ((shared_ptr<SchemePair> *)&visited._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::shared_ptr<SchemeObject>::~shared_ptr
            ((shared_ptr<SchemeObject> *)
             &pp.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_c0);
LAB_00160806:
  std::shared_ptr<SchemeSymbol>::~shared_ptr
            ((shared_ptr<SchemeSymbol> *)((long)&prefix.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string SchemePair::external_repr() const
{
    if(!car)
        return "()";
    auto pcar = std::dynamic_pointer_cast<SchemeSymbol>(car);
    if(pcar)
    {
        std::string prefix = "";
        if(pcar->value == "quote")
            prefix = "'";
        else if(pcar->value == "quasiquote")
            prefix = "`";
        else if(pcar->value == "unquote")
            prefix = ",";
        else if(pcar->value == "unquote-splicing")
            prefix = ",@";
        if(prefix.length())
        {
            auto pcdr = std::dynamic_pointer_cast<SchemePair>(cdr);
            if(pcdr && pcdr->cdr == scheme_nil)
                return prefix + pcdr->car->external_repr();
        }
    }
    std::string res = "(" + car->external_repr();
    std::shared_ptr<SchemeObject> p = cdr;
    std::shared_ptr<SchemePair> pp;
    std::set<const SchemePair *> visited{this};
    while((pp = std::dynamic_pointer_cast<SchemePair>(p)))
    {
        if(p == scheme_nil)
            return res + ")";
        res += " " + pp->car->external_repr();
        if(visited.count(pp.get()))
            return res + " ...)";
        p = pp->cdr;
        visited.insert(pp.get());
    }
    return res + " . " + p->external_repr() + ")";
}